

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_receiver.c
# Opt level: O0

AMQP_VALUE
on_transfer_received
          (void *context,TRANSFER_HANDLE transfer,uint32_t payload_size,uchar *payload_bytes)

{
  int iVar1;
  MESSAGE_HANDLE message_00;
  LOGGER_LOG p_Var2;
  AMQPVALUE_DECODER_HANDLE handle;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  AMQPVALUE_DECODER_HANDLE amqpvalue_decoder;
  LOGGER_LOG l;
  MESSAGE_HANDLE message;
  MESSAGE_RECEIVER_INSTANCE *message_receiver;
  AMQP_VALUE result;
  uchar *payload_bytes_local;
  uint32_t payload_size_local;
  TRANSFER_HANDLE transfer_local;
  void *context_local;
  
  message_receiver = (MESSAGE_RECEIVER_INSTANCE *)0x0;
  if (*(long *)((long)context + 8) != 0) {
    message_00 = message_create();
    if (message_00 == (MESSAGE_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_receiver.c"
                  ,"on_transfer_received",0xef,1,"Cannot create message");
      }
      set_message_receiver_state((MESSAGE_RECEIVER_INSTANCE *)context,MESSAGE_RECEIVER_STATE_ERROR);
    }
    else {
      handle = amqpvalue_decoder_create(decode_message_value_callback,context);
      if (handle == (AMQPVALUE_DECODER_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_receiver.c"
                    ,"on_transfer_received",0xf7,1,"Cannot create AMQP value decoder");
        }
        set_message_receiver_state
                  ((MESSAGE_RECEIVER_INSTANCE *)context,MESSAGE_RECEIVER_STATE_ERROR);
      }
      else {
        *(MESSAGE_HANDLE *)((long)context + 0x30) = message_00;
        *(undefined1 *)((long)context + 0x38) = 0;
        iVar1 = amqpvalue_decode_bytes(handle,payload_bytes,(ulong)payload_size);
        if (iVar1 == 0) {
          if ((*(byte *)((long)context + 0x38) & 1) == 0) {
            message_receiver =
                 (MESSAGE_RECEIVER_INSTANCE *)
                 (**(code **)((long)context + 8))(*(undefined8 *)((long)context + 0x28),message_00);
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_receiver.c"
                        ,"on_transfer_received",0x107,1,"Error decoding message");
            }
            set_message_receiver_state
                      ((MESSAGE_RECEIVER_INSTANCE *)context,MESSAGE_RECEIVER_STATE_ERROR);
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_receiver.c"
                      ,"on_transfer_received",0x100,1,"Cannot decode bytes");
          }
          set_message_receiver_state
                    ((MESSAGE_RECEIVER_INSTANCE *)context,MESSAGE_RECEIVER_STATE_ERROR);
        }
        amqpvalue_decoder_destroy(handle);
      }
      message_destroy(message_00);
    }
  }
  return (AMQP_VALUE)message_receiver;
}

Assistant:

static AMQP_VALUE on_transfer_received(void* context, TRANSFER_HANDLE transfer, uint32_t payload_size, const unsigned char* payload_bytes)
{
    AMQP_VALUE result = NULL;
    MESSAGE_RECEIVER_INSTANCE* message_receiver = (MESSAGE_RECEIVER_INSTANCE*)context;

    (void)transfer;
    if (message_receiver->on_message_received != NULL)
    {
        MESSAGE_HANDLE message = message_create();
        if (message == NULL)
        {
            LogError("Cannot create message");
            set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_ERROR);
        }
        else
        {
            AMQPVALUE_DECODER_HANDLE amqpvalue_decoder = amqpvalue_decoder_create(decode_message_value_callback, message_receiver);
            if (amqpvalue_decoder == NULL)
            {
                LogError("Cannot create AMQP value decoder");
                set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_ERROR);
            }
            else
            {
                message_receiver->decoded_message = message;
                message_receiver->decode_error = false;
                if (amqpvalue_decode_bytes(amqpvalue_decoder, payload_bytes, payload_size) != 0)
                {
                    LogError("Cannot decode bytes");
                    set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_ERROR);
                }
                else
                {
                    if (message_receiver->decode_error)
                    {
                        LogError("Error decoding message");
                        set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_ERROR);
                    }
                    else
                    {
                        result = message_receiver->on_message_received(message_receiver->callback_context, message);
                    }
                }

                amqpvalue_decoder_destroy(amqpvalue_decoder);
            }

            message_destroy(message);
        }
    }

    return result;
}